

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int pushline(lua_State *L,int firstline)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char *__s;
  undefined8 uStack_230;
  char buffer [512];
  
  pcVar2 = "_PROMPT";
  __s = "> ";
  if (firstline == 0) {
    pcVar2 = "_PROMPT2";
    __s = ">> ";
  }
  uStack_230 = 0x103033;
  lua_getglobal(L,pcVar2);
  iVar3 = 0;
  uStack_230 = 0x103043;
  pcVar2 = (char *)lua_tolstring(L,0xffffffffffffffff,0);
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  uStack_230 = 0x10305d;
  fputs(__s,_stdout);
  uStack_230 = 0x103066;
  fflush(_stdout);
  uStack_230 = 0x10307d;
  pcVar2 = fgets(buffer,0x200,_stdin);
  if (pcVar2 != (char *)0x0) {
    uStack_230 = 0x10308d;
    lua_settop(L,0xfffffffffffffffe);
    uStack_230 = 0x103095;
    sVar1 = strlen(buffer);
    if (sVar1 == 0) {
      sVar1 = 0;
    }
    else if (buffer[sVar1 - 1] == '\n') {
      buffer[sVar1 - 1] = '\0';
      sVar1 = sVar1 - 1;
    }
    if ((firstline == 0) || (buffer[0] != '=')) {
      uStack_230 = 0x1030dd;
      lua_pushlstring(L,buffer,sVar1);
    }
    else {
      uStack_230 = 0x1030cd;
      lua_pushfstring(L,"return %s",buffer + 1);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int pushline (lua_State *L, int firstline) {
  char buffer[LUA_MAXINPUT];
  char *b = buffer;
  size_t l;
  const char *prmt = get_prompt(L, firstline);
  int readstatus = lua_readline(L, b, prmt);
  if (readstatus == 0)
    return 0;  /* no input (prompt will be popped by caller) */
  lua_pop(L, 1);  /* remove prompt */
  l = strlen(b);
  if (l > 0 && b[l-1] == '\n')  /* line ends with newline? */
    b[--l] = '\0';  /* remove it */
  if (firstline && b[0] == '=')  /* for compatibility with 5.2, ... */
    lua_pushfstring(L, "return %s", b + 1);  /* change '=' to 'return' */
  else
    lua_pushlstring(L, b, l);
  lua_freeline(L, b);
  return 1;
}